

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inherit.cc
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  allocator local_29;
  string local_28;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Inherited logger used:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_28,"query",&local_29);
  QueryHandler2(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  poVar1 = std::operator<<((ostream *)&std::cerr,"New logger used:");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_28,"another query",&local_29);
  QueryHandler1(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main() {
  std::cerr << "Inherited logger used:" << std::endl;
  QueryHandler2("query");
  std::cerr << "New logger used:" << std::endl;
  QueryHandler1("another query");
}